

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformedBilinearARGB32PM_fast_rotate_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int fdy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  long lVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  int iVar40;
  uint uVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  ulong uVar54;
  long lVar55;
  uint *puVar56;
  uint uVar57;
  undefined1 auVar58 [16];
  uint uVar65;
  uint uVar67;
  undefined1 auVar59 [12];
  uint uVar64;
  uint uVar66;
  uint uVar68;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar69;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  short sVar70;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  undefined1 auVar71 [12];
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar73 [16];
  short sVar87;
  short sVar88;
  undefined1 in_XMM14 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar72 [16];
  
  uVar46 = (ulong)(uint)fdx;
  uVar54 = (ulong)(uint)fdy;
  iVar44 = image->x1;
  iVar48 = image->x2;
  iVar51 = image->y1;
  iVar52 = image->y2;
  puVar4 = image->imageData;
  lVar5 = image->bytesPerLine;
  for (; b < end; b = b + 1) {
    iVar50 = *fx >> 0x10;
    iVar47 = *fy >> 0x10;
    iVar43 = image->x2 + -1;
    iVar40 = iVar43;
    if (iVar50 < iVar43) {
      iVar43 = iVar50;
      iVar40 = iVar50 + 1;
    }
    iVar1 = image->x1;
    if (iVar50 < iVar1) {
      iVar40 = iVar1;
      iVar43 = iVar1;
    }
    iVar50 = image->y2 + -1;
    iVar1 = iVar50;
    if (iVar47 < iVar50) {
      iVar50 = iVar47;
      iVar1 = iVar47 + 1;
    }
    iVar2 = image->y1;
    if (iVar47 < iVar2) {
      iVar1 = iVar2;
      iVar50 = iVar2;
    }
    if ((iVar43 != iVar40) && (iVar50 != iVar1)) break;
    uVar41 = interpolate_4_pixels
                       (*(uint *)(puVar4 + (long)iVar43 * 4 + iVar50 * lVar5),
                        *(uint *)(puVar4 + (long)iVar40 * 4 + iVar50 * lVar5),
                        *(uint *)(puVar4 + (long)iVar43 * 4 + iVar1 * lVar5),
                        *(uint *)(puVar4 + (long)iVar40 * 4 + iVar1 * lVar5),(uint)*fx >> 8 & 0xff,
                        (uint)*fy >> 8 & 0xff);
    *b = uVar41;
    *fx = *fx + fdx;
    *fy = *fy + fdy;
  }
  if (fdx < 1) {
    puVar56 = end;
    if (fdx < 0) {
      lVar42 = (long)iVar44 * 0x10000 - (long)*fx;
      uVar46 = (ulong)fdx;
      goto LAB_005ae4ba;
    }
  }
  else {
    lVar42 = ((long)iVar48 * 0x10000 + -0x10000) - (long)*fx;
LAB_005ae4ba:
    puVar56 = b + lVar42 / (long)uVar46;
    if (end < b + lVar42 / (long)uVar46) {
      puVar56 = end;
    }
  }
  if (fdy < 1) {
    iVar44 = *fy;
    if (-1 < fdy) goto LAB_005ae521;
    lVar42 = (long)iVar51 * 0x10000 - (long)iVar44;
    uVar54 = (ulong)fdy;
  }
  else {
    iVar44 = *fy;
    lVar42 = ((long)iVar52 * 0x10000 + -0x10000) - (long)iVar44;
  }
  if (b + lVar42 / (long)uVar54 <= puVar56) {
    puVar56 = b + lVar42 / (long)uVar54;
  }
LAB_005ae521:
  iVar48 = *fx + fdx;
  iVar51 = iVar48 + fdx;
  auVar63._12_4_ = iVar51 + fdx;
  auVar63._8_4_ = iVar51;
  auVar63._4_4_ = iVar48;
  auVar63._0_4_ = *fx;
  iVar48 = iVar44 + fdy + fdy;
  auVar90._12_4_ = iVar48 + fdy;
  auVar90._8_4_ = iVar48;
  auVar90._4_4_ = iVar44 + fdy;
  auVar90._0_4_ = iVar44;
  auVar58 = ZEXT416((uint)(lVar5 / 4));
  auVar58 = pshuflw(auVar58,auVar58,0);
  while( true ) {
    uVar3 = auVar63._0_4_;
    uVar57 = auVar90._0_4_;
    if (puVar56 + -3 <= b) break;
    auVar60._0_4_ = uVar57 >> 0x10;
    uVar64 = auVar90._4_4_;
    auVar60._4_4_ = uVar64 >> 0x10;
    uVar66 = auVar90._8_4_;
    uVar68 = auVar90._12_4_;
    auVar60._8_4_ = uVar66 >> 0x10;
    auVar60._12_4_ = uVar68 >> 0x10;
    auVar60 = packssdw(auVar60,_DAT_005c4870);
    sVar78 = auVar60._6_2_ * auVar58._6_2_;
    auVar61 = pmulhw(auVar60,auVar58);
    iVar44 = CONCAT22(auVar61._6_2_,sVar78);
    Var39 = CONCAT64(CONCAT42(iVar44,auVar61._4_2_),CONCAT22(auVar60._4_2_ * auVar58._4_2_,sVar78));
    auVar38._4_8_ = (long)((unkuint10)Var39 >> 0x10);
    auVar38._2_2_ = auVar61._2_2_;
    auVar38._0_2_ = auVar60._2_2_ * auVar58._2_2_;
    uVar65 = auVar63._4_4_;
    uVar67 = auVar63._8_4_;
    uVar69 = auVar63._12_4_;
    lVar45 = (long)(int)((uVar3 >> 0x10) + CONCAT22(auVar61._0_2_,auVar60._0_2_ * auVar58._0_2_));
    lVar49 = (long)(int)((uVar65 >> 0x10) + auVar38._0_4_);
    lVar53 = (long)(int)((uVar67 >> 0x10) + (int)((unkuint10)Var39 >> 0x10));
    lVar55 = (long)(int)((uVar69 >> 0x10) + iVar44);
    uVar20 = *(ushort *)(puVar4 + lVar55 * 4 + 0xc);
    uVar21 = *(ushort *)(puVar4 + lVar55 * 4 + 0xe);
    uVar18 = *(ushort *)(puVar4 + lVar53 * 4 + 8);
    uVar19 = *(ushort *)(puVar4 + lVar53 * 4 + 10);
    uVar14 = *(ushort *)(puVar4 + lVar45 * 4);
    uVar15 = *(ushort *)((long)(puVar4 + lVar45 * 4) + 2);
    uVar16 = *(ushort *)(puVar4 + lVar49 * 4 + 4);
    uVar17 = *(ushort *)(puVar4 + lVar49 * 4 + 6);
    uVar36 = *(ushort *)(puVar4 + lVar55 * 4 + 0x10);
    uVar37 = *(ushort *)(puVar4 + lVar55 * 4 + 0x12);
    uVar34 = *(ushort *)(puVar4 + lVar53 * 4 + 0xc);
    uVar35 = *(ushort *)(puVar4 + lVar53 * 4 + 0xe);
    uVar30 = *(ushort *)(puVar4 + lVar45 * 4 + 4);
    uVar31 = *(ushort *)((long)(puVar4 + lVar45 * 4 + 4) + 2);
    uVar32 = *(ushort *)(puVar4 + lVar49 * 4 + 8);
    uVar33 = *(ushort *)(puVar4 + lVar49 * 4 + 10);
    lVar42 = lVar55 * 4 + lVar5;
    uVar12 = *(ushort *)(puVar4 + lVar42 + 0xc);
    uVar13 = *(ushort *)(puVar4 + lVar42 + 0xe);
    lVar42 = lVar53 * 4 + lVar5;
    uVar10 = *(ushort *)(puVar4 + lVar42 + 8);
    uVar11 = *(ushort *)(puVar4 + lVar42 + 10);
    uVar6 = *(ushort *)(puVar4 + lVar45 * 4 + lVar5);
    uVar7 = *(ushort *)((long)(puVar4 + lVar45 * 4 + lVar5) + 2);
    lVar42 = lVar49 * 4 + lVar5;
    uVar8 = *(ushort *)(puVar4 + lVar42 + 4);
    uVar9 = *(ushort *)(puVar4 + lVar42 + 6);
    lVar42 = lVar55 * 4 + lVar5 + 4;
    uVar28 = *(ushort *)(puVar4 + lVar42 + 0xc);
    uVar29 = *(ushort *)(puVar4 + lVar42 + 0xe);
    lVar42 = lVar53 * 4 + lVar5 + 4;
    uVar26 = *(ushort *)(puVar4 + lVar42 + 8);
    uVar27 = *(ushort *)(puVar4 + lVar42 + 10);
    uVar22 = *(ushort *)(puVar4 + lVar45 * 4 + lVar5 + 4);
    uVar23 = *(ushort *)((long)(puVar4 + lVar45 * 4 + lVar5 + 4) + 2);
    lVar42 = lVar49 * 4 + lVar5 + 4;
    uVar24 = *(ushort *)(puVar4 + lVar42 + 4);
    uVar25 = *(ushort *)(puVar4 + lVar42 + 6);
    iVar44 = CONCAT22(auVar63._2_2_ >> 8,auVar63._0_2_ >> 8);
    auVar59._0_8_ = CONCAT26(auVar63._6_2_ >> 8,CONCAT24(auVar63._4_2_ >> 8,iVar44));
    auVar59._8_2_ = auVar63._8_2_ >> 8;
    auVar59._10_2_ = auVar63._10_2_ >> 8;
    auVar61._12_2_ = auVar63._12_2_ >> 8;
    auVar61._0_12_ = auVar59;
    auVar61._14_2_ = auVar63._14_2_ >> 8;
    iVar48 = CONCAT22(auVar90._2_2_ >> 8,auVar90._0_2_ >> 8);
    auVar71._0_8_ = CONCAT26(auVar90._6_2_ >> 8,CONCAT24(auVar90._4_2_ >> 8,iVar48));
    auVar71._8_2_ = auVar90._8_2_ >> 8;
    auVar71._10_2_ = auVar90._10_2_ >> 8;
    auVar72._12_2_ = auVar90._12_2_ >> 8;
    auVar72._0_12_ = auVar71;
    auVar72._14_2_ = auVar90._14_2_ >> 8;
    auVar62._0_4_ = iVar44 + 8;
    auVar62._4_4_ = (int)((ulong)auVar59._0_8_ >> 0x20) + 8;
    auVar62._8_4_ = auVar59._8_4_ + 8;
    auVar62._12_4_ = auVar61._12_4_ + 8;
    auVar73._0_4_ = iVar48 + 8;
    auVar73._4_4_ = (int)((ulong)auVar71._0_8_ >> 0x20) + 8;
    auVar73._8_4_ = auVar71._8_4_ + 8;
    auVar73._12_4_ = auVar72._12_4_ + 8;
    auVar63 = pshuflw(auVar62,auVar62,0xa0);
    auVar90 = pshufhw(in_XMM15,auVar63,0xa0);
    auVar91._0_2_ = auVar90._0_2_ >> 4;
    auVar91._2_2_ = auVar90._2_2_ >> 4;
    auVar91._4_2_ = auVar90._4_2_ >> 4;
    auVar91._6_2_ = auVar90._6_2_ >> 4;
    auVar91._8_2_ = auVar90._8_2_ >> 4;
    auVar91._10_2_ = auVar90._10_2_ >> 4;
    auVar91._12_2_ = auVar90._12_2_ >> 4;
    auVar91._14_2_ = auVar90._14_2_ >> 4;
    auVar63 = pshuflw(auVar63,auVar73,0xa0);
    auVar63 = pshufhw(in_XMM14,auVar63,0xa0);
    auVar89._0_2_ = auVar63._0_2_ >> 4;
    auVar89._2_2_ = auVar63._2_2_ >> 4;
    auVar89._4_2_ = auVar63._4_2_ >> 4;
    auVar89._6_2_ = auVar63._6_2_ >> 4;
    auVar89._8_2_ = auVar63._8_2_ >> 4;
    auVar89._10_2_ = auVar63._10_2_ >> 4;
    auVar89._12_2_ = auVar63._12_2_ >> 4;
    auVar89._14_2_ = auVar63._14_2_ >> 4;
    sVar78 = auVar91._0_2_ * auVar89._0_2_;
    sVar74 = auVar91._2_2_ * auVar89._2_2_;
    sVar76 = auVar91._4_2_ * auVar89._4_2_;
    sVar79 = auVar91._6_2_ * auVar89._6_2_;
    sVar81 = auVar91._8_2_ * auVar89._8_2_;
    sVar83 = auVar91._10_2_ * auVar89._10_2_;
    sVar85 = auVar91._12_2_ * auVar89._12_2_;
    sVar87 = auVar91._14_2_ * auVar89._14_2_;
    auVar90 = psllw(auVar91,4);
    auVar63 = psllw(auVar89,4);
    in_XMM15._0_2_ = auVar90._0_2_ - sVar78;
    in_XMM15._2_2_ = auVar90._2_2_ - sVar74;
    in_XMM15._4_2_ = auVar90._4_2_ - sVar76;
    in_XMM15._6_2_ = auVar90._6_2_ - sVar79;
    in_XMM15._8_2_ = auVar90._8_2_ - sVar81;
    in_XMM15._10_2_ = auVar90._10_2_ - sVar83;
    in_XMM15._12_2_ = auVar90._12_2_ - sVar85;
    in_XMM15._14_2_ = auVar90._14_2_ - sVar87;
    in_XMM14._0_2_ = auVar63._0_2_ - sVar78;
    in_XMM14._2_2_ = auVar63._2_2_ - sVar74;
    in_XMM14._4_2_ = auVar63._4_2_ - sVar76;
    in_XMM14._6_2_ = auVar63._6_2_ - sVar79;
    in_XMM14._8_2_ = auVar63._8_2_ - sVar81;
    in_XMM14._10_2_ = auVar63._10_2_ - sVar83;
    in_XMM14._12_2_ = auVar63._12_2_ - sVar85;
    in_XMM14._14_2_ = auVar63._14_2_ - sVar87;
    sVar70 = (sVar78 - (auVar63._0_2_ + auVar90._0_2_)) + 0x100;
    sVar75 = (sVar74 - (auVar63._2_2_ + auVar90._2_2_)) + 0x100;
    sVar77 = (sVar76 - (auVar63._4_2_ + auVar90._4_2_)) + 0x100;
    sVar80 = (sVar79 - (auVar63._6_2_ + auVar90._6_2_)) + 0x100;
    sVar82 = (sVar81 - (auVar63._8_2_ + auVar90._8_2_)) + 0x100;
    sVar84 = (sVar83 - (auVar63._10_2_ + auVar90._10_2_)) + 0x100;
    sVar86 = (sVar85 - (auVar63._12_2_ + auVar90._12_2_)) + 0x100;
    sVar88 = (sVar87 - (auVar63._14_2_ + auVar90._14_2_)) + 0x100;
    *(ushort *)b = (ushort)((uVar22 & 0xff) * sVar78 + (uVar6 & 0xff) * in_XMM14._0_2_ +
                           (uVar30 & 0xff) * in_XMM15._0_2_ + (uVar14 & 0xff) * sVar70) >> 8 |
                   (uVar22 >> 8) * sVar78 + (uVar6 >> 8) * in_XMM14._0_2_ +
                   (uVar30 >> 8) * in_XMM15._0_2_ + (uVar14 >> 8) * sVar70 & 0xff00;
    *(ushort *)((long)b + 2) =
         (ushort)((uVar23 & 0xff) * sVar74 + (uVar7 & 0xff) * in_XMM14._2_2_ +
                 (uVar31 & 0xff) * in_XMM15._2_2_ + (uVar15 & 0xff) * sVar75) >> 8 |
         (uVar23 >> 8) * sVar74 + (uVar7 >> 8) * in_XMM14._2_2_ +
         (uVar31 >> 8) * in_XMM15._2_2_ + (uVar15 >> 8) * sVar75 & 0xff00;
    *(ushort *)(b + 1) =
         (ushort)((uVar24 & 0xff) * sVar76 + (uVar8 & 0xff) * in_XMM14._4_2_ +
                 (uVar32 & 0xff) * in_XMM15._4_2_ + (uVar16 & 0xff) * sVar77) >> 8 |
         (uVar24 >> 8) * sVar76 + (uVar8 >> 8) * in_XMM14._4_2_ +
         (uVar32 >> 8) * in_XMM15._4_2_ + (uVar16 >> 8) * sVar77 & 0xff00;
    *(ushort *)((long)b + 6) =
         (ushort)((uVar25 & 0xff) * sVar79 + (uVar9 & 0xff) * in_XMM14._6_2_ +
                 (uVar33 & 0xff) * in_XMM15._6_2_ + (uVar17 & 0xff) * sVar80) >> 8 |
         (uVar25 >> 8) * sVar79 + (uVar9 >> 8) * in_XMM14._6_2_ +
         (uVar33 >> 8) * in_XMM15._6_2_ + (uVar17 >> 8) * sVar80 & 0xff00;
    *(ushort *)(b + 2) =
         (ushort)((uVar26 & 0xff) * sVar81 + (uVar10 & 0xff) * in_XMM14._8_2_ +
                 (uVar34 & 0xff) * in_XMM15._8_2_ + (uVar18 & 0xff) * sVar82) >> 8 |
         (uVar26 >> 8) * sVar81 + (uVar10 >> 8) * in_XMM14._8_2_ +
         (uVar34 >> 8) * in_XMM15._8_2_ + (uVar18 >> 8) * sVar82 & 0xff00;
    *(ushort *)((long)b + 10) =
         (ushort)((uVar27 & 0xff) * sVar83 + (uVar11 & 0xff) * in_XMM14._10_2_ +
                 (uVar35 & 0xff) * in_XMM15._10_2_ + (uVar19 & 0xff) * sVar84) >> 8 |
         (uVar27 >> 8) * sVar83 + (uVar11 >> 8) * in_XMM14._10_2_ +
         (uVar35 >> 8) * in_XMM15._10_2_ + (uVar19 >> 8) * sVar84 & 0xff00;
    *(ushort *)(b + 3) =
         (ushort)((uVar28 & 0xff) * sVar85 + (uVar12 & 0xff) * in_XMM14._12_2_ +
                 (uVar36 & 0xff) * in_XMM15._12_2_ + (uVar20 & 0xff) * sVar86) >> 8 |
         (uVar28 >> 8) * sVar85 + (uVar12 >> 8) * in_XMM14._12_2_ +
         (uVar36 >> 8) * in_XMM15._12_2_ + (uVar20 >> 8) * sVar86 & 0xff00;
    *(ushort *)((long)b + 0xe) =
         (ushort)((uVar29 & 0xff) * sVar87 + (uVar13 & 0xff) * in_XMM14._14_2_ +
                 (uVar37 & 0xff) * in_XMM15._14_2_ + (uVar21 & 0xff) * sVar88) >> 8 |
         (uVar29 >> 8) * sVar87 + (uVar13 >> 8) * in_XMM14._14_2_ +
         (uVar37 >> 8) * in_XMM15._14_2_ + (uVar21 >> 8) * sVar88 & 0xff00;
    b = b + 4;
    auVar63._0_4_ = uVar3 + fdx * 4;
    auVar63._4_4_ = uVar65 + fdx * 4;
    auVar63._8_4_ = uVar67 + fdx * 4;
    auVar63._12_4_ = uVar69 + fdx * 4;
    auVar90._0_4_ = uVar57 + fdy * 4;
    auVar90._4_4_ = uVar64 + fdy * 4;
    auVar90._8_4_ = uVar66 + fdy * 4;
    auVar90._12_4_ = uVar68 + fdy * 4;
  }
  *fx = uVar3;
  *fy = uVar57;
  puVar4 = image->imageData;
  lVar5 = image->bytesPerLine;
  for (; b < puVar56; b = b + 1) {
    lVar42 = (long)(*fx >> 0x10);
    uVar41 = interpolate_4_pixels
                       ((uint *)(puVar4 + lVar42 * 4 + lVar5 * ((int)uVar57 >> 0x10)),
                        (uint *)(puVar4 + lVar42 * 4 + (((int)uVar57 >> 0x10) + 1) * lVar5),
                        (uint)*fx >> 8 & 0xff,uVar57 >> 8 & 0xff);
    *b = uVar41;
    *fx = *fx + fdx;
    uVar57 = *fy + fdy;
    *fy = uVar57;
  }
  puVar4 = image->imageData;
  lVar5 = image->bytesPerLine;
  for (; b < end; b = b + 1) {
    iVar52 = *fx >> 0x10;
    iVar51 = (int)uVar57 >> 0x10;
    iVar44 = image->x2 + -1;
    iVar48 = iVar44;
    if (iVar52 < iVar44) {
      iVar44 = iVar52;
      iVar48 = iVar52 + 1;
    }
    iVar43 = image->x1;
    iVar40 = image->y1;
    if (iVar52 < iVar43) {
      iVar48 = iVar43;
      iVar44 = iVar43;
    }
    iVar52 = image->y2 + -1;
    iVar43 = iVar52;
    if (iVar51 < iVar52) {
      iVar52 = iVar51;
      iVar43 = iVar51 + 1;
    }
    if (iVar51 < iVar40) {
      iVar43 = iVar40;
      iVar52 = iVar40;
    }
    lVar42 = iVar52 * lVar5;
    lVar45 = iVar43 * lVar5;
    uVar41 = interpolate_4_pixels
                       (*(uint *)(puVar4 + (long)iVar44 * 4 + lVar42),
                        *(uint *)(puVar4 + (long)iVar48 * 4 + lVar42),
                        *(uint *)(puVar4 + (long)iVar44 * 4 + lVar45),
                        *(uint *)(puVar4 + (long)iVar48 * 4 + lVar45),(uint)*fx >> 8 & 0xff,
                        uVar57 >> 8 & 0xff);
    *b = uVar41;
    *fx = *fx + fdx;
    uVar57 = *fy + fdy;
    *fy = uVar57;
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_fast_rotate_helper(uint *b, uint *end, const QTextureData &image,
                                                                            int &fx, int &fy, int fdx, int fdy)
{
    //we are zooming less than 8x, use 4bit precision
    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        const qint64 min_fy = qint64(image.y1) * fixed_scale;
        const qint64 max_fy = qint64(image.y2 - 1) * fixed_scale;
        // first handle the possibly bounded part in the beginning
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            int y1 = (fy >> 16);
            int y2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
            if (x1 != x2 && y1 != y2)
                break;
            const uint *s1 = (const uint *)image.scanLine(y1);
            const uint *s2 = (const uint *)image.scanLine(y2);
            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];
            if (hasFastInterpolate4()) {
                int distx = (fx & 0x0000ffff) >> 8;
                int disty = (fy & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);
            } else {
                int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
            }
            fx += fdx;
            fy += fdy;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);
        if (fdy > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fy - fy) / fdy);
        else if (fdy < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fy - fy) / fdy);

        // until boundedEnd we can now have a fast middle part without boundary checks
#if defined(__SSE2__)
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
        const __m128i v_256 = _mm_set1_epi16(256);
        const __m128i v_fdx = _mm_set1_epi32(fdx*4);
        const __m128i v_fdy = _mm_set1_epi32(fdy*4);
        const __m128i v_fxy_r = _mm_set1_epi32(0x8);
        __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);
        __m128i v_fy = _mm_setr_epi32(fy, fy + fdy, fy + fdy + fdy, fy + fdy + fdy + fdy);

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;
        const __m128i vbpl = _mm_shufflelo_epi16(_mm_cvtsi32_si128(bytesPerLine/4), _MM_SHUFFLE(0, 0, 0, 0));

        while (b < boundedEnd - 3) {
            const __m128i vy = _mm_packs_epi32(_mm_srli_epi32(v_fy, 16), _mm_setzero_si128());
            // 4x16bit * 4x16bit -> 4x32bit
            __m128i offset = _mm_unpacklo_epi16(_mm_mullo_epi16(vy, vbpl), _mm_mulhi_epi16(vy, vbpl));
            offset = _mm_add_epi32(offset, _mm_srli_epi32(v_fx, 16));
            const int offset0 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset1 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset2 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset3 = _mm_cvtsi128_si32(offset);
            const uint *topData = (const uint *)(textureData);
            const __m128i tl = _mm_setr_epi32(topData[offset0], topData[offset1], topData[offset2], topData[offset3]);
            const __m128i tr = _mm_setr_epi32(topData[offset0 + 1], topData[offset1 + 1], topData[offset2 + 1], topData[offset3 + 1]);
            const uint *bottomData = (const uint *)(textureData + bytesPerLine);
            const __m128i bl = _mm_setr_epi32(bottomData[offset0], bottomData[offset1], bottomData[offset2], bottomData[offset3]);
            const __m128i br = _mm_setr_epi32(bottomData[offset0 + 1], bottomData[offset1 + 1], bottomData[offset2 + 1], bottomData[offset3 + 1]);

            __m128i v_distx = _mm_srli_epi16(v_fx, 8);
            __m128i v_disty = _mm_srli_epi16(v_fy, 8);
            v_distx = _mm_srli_epi16(_mm_add_epi32(v_distx, v_fxy_r), 4);
            v_disty = _mm_srli_epi16(_mm_add_epi32(v_disty, v_fxy_r), 4);
            v_distx = _mm_shufflehi_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_distx = _mm_shufflelo_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_disty = _mm_shufflehi_epi16(v_disty, _MM_SHUFFLE(2,2,0,0));
            v_disty = _mm_shufflelo_epi16(v_disty, _MM_SHUFFLE(2,2,0,0));

            interpolate_4_pixels_16_sse2(tl, tr, bl, br, v_distx, v_disty, colorMask, v_256, b);
            b += 4;
            v_fx = _mm_add_epi32(v_fx, v_fdx);
            v_fy = _mm_add_epi32(v_fy, v_fdy);
        }
        fx = _mm_cvtsi128_si32(v_fx);
        fy = _mm_cvtsi128_si32(v_fy);
#elif defined(__ARM_NEON__)
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);
        const int16x8_t invColorMask = vmvnq_s16(colorMask);
        const int16x8_t v_256 = vdupq_n_s16(256);
        int32x4_t v_fdx = vdupq_n_s32(fdx * 4);
        int32x4_t v_fdy = vdupq_n_s32(fdy * 4);

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;

        int32x4_t v_fx = vmovq_n_s32(fx);
        int32x4_t v_fy = vmovq_n_s32(fy);
        v_fx = vsetq_lane_s32(fx + fdx, v_fx, 1);
        v_fy = vsetq_lane_s32(fy + fdy, v_fy, 1);
        v_fx = vsetq_lane_s32(fx + fdx * 2, v_fx, 2);
        v_fy = vsetq_lane_s32(fy + fdy * 2, v_fy, 2);
        v_fx = vsetq_lane_s32(fx + fdx * 3, v_fx, 3);
        v_fy = vsetq_lane_s32(fy + fdy * 3, v_fy, 3);

        const int32x4_t v_ffff_mask = vdupq_n_s32(0x0000ffff);
        const int32x4_t v_round = vdupq_n_s32(0x0800);

         // Pre-initialize to work-around code-analysis warnings/crashes in MSVC:
        uint32x4x2_t v_top = {};
        uint32x4x2_t v_bot = {};
        while (b < boundedEnd - 3) {
            int x1 = (fx >> 16);
            int y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            const uchar *sl = textureData + bytesPerLine * y1;
            const uint *s1 = reinterpret_cast<const uint *>(sl);
            const uint *s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 0);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 0);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 1);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 1);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 2);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 2);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 3);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 3);

            int32x4_t v_distx = vshrq_n_s32(vaddq_s32(vandq_s32(v_fx, v_ffff_mask), v_round), 12);
            int32x4_t v_disty = vshrq_n_s32(vaddq_s32(vandq_s32(v_fy, v_ffff_mask), v_round), 12);
            v_distx = vorrq_s32(v_distx, vshlq_n_s32(v_distx, 16));
            v_disty = vorrq_s32(v_disty, vshlq_n_s32(v_disty, 16));
            int16x8_t v_disty_ = vshlq_n_s16(vreinterpretq_s16_s32(v_disty), 4);

            interpolate_4_pixels_16_neon(
                        vreinterpretq_s16_u32(v_top.val[0]), vreinterpretq_s16_u32(v_top.val[1]),
                        vreinterpretq_s16_u32(v_bot.val[0]), vreinterpretq_s16_u32(v_bot.val[1]),
                        vreinterpretq_s16_s32(v_distx), vreinterpretq_s16_s32(v_disty),
                        v_disty_, colorMask, invColorMask, v_256, b);
            b += 4;
            v_fx = vaddq_s32(v_fx, v_fdx);
            v_fy = vaddq_s32(v_fy, v_fdy);
        }
#elif defined(__loongarch_sx)
        const __m128i v_fdx = __lsx_vreplgr2vr_w(fdx*4);
        const __m128i v_fdy = __lsx_vreplgr2vr_w(fdy*4);
        const __m128i v_fxy_r = __lsx_vreplgr2vr_w(0x8);
        __m128i v_fx = (__m128i)(v4i32){fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx};
        __m128i v_fy = (__m128i)(v4i32){fy, fy + fdy, fy + fdy + fdy, fy + fdy + fdy + fdy};

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;
        const __m128i zero = __lsx_vldi(0);
        const __m128i shuffleMask = (__m128i)(v8i16){0, 0, 0, 0, 4, 5, 6, 7};
        const __m128i shuffleMask1 = (__m128i)(v8i16){0, 0, 2, 2, 4, 4, 6, 6};
        const __m128i vbpl = __lsx_vshuf_h(shuffleMask, zero, __lsx_vinsgr2vr_w(zero, bytesPerLine/4, 0));

        while (b < boundedEnd - 3) {
            const __m128i vy = __lsx_vpickev_h(zero, __lsx_vsat_w(__lsx_vsrli_w(v_fy, 16), 15));
            // 4x16bit * 4x16bit -> 4x32bit
            __m128i offset = __lsx_vilvl_h(__lsx_vmuh_h(vy, vbpl), __lsx_vmul_h(vy, vbpl));
            offset = __lsx_vadd_w(offset, __lsx_vsrli_w(v_fx, 16));
            const int offset0 = __lsx_vpickve2gr_w(offset, 0);
            const int offset1 = __lsx_vpickve2gr_w(offset, 1);
            const int offset2 = __lsx_vpickve2gr_w(offset, 2);
            const int offset3 = __lsx_vpickve2gr_w(offset, 3);
            const uint *topData = (const uint *)(textureData);
            const __m128i tl = (__m128i)(v4u32){topData[offset0], topData[offset1], topData[offset2], topData[offset3]};
            const __m128i tr = (__m128i)(v4u32){topData[offset0 + 1], topData[offset1 + 1], topData[offset2 + 1], topData[offset3 + 1]};
            const uint *bottomData = (const uint *)(textureData + bytesPerLine);
            const __m128i bl = (__m128i)(v4u32){bottomData[offset0], bottomData[offset1], bottomData[offset2], bottomData[offset3]};
            const __m128i br = (__m128i)(v4u32){bottomData[offset0 + 1], bottomData[offset1 + 1], bottomData[offset2 + 1], bottomData[offset3 + 1]};

            __m128i v_distx = __lsx_vsrli_h(v_fx, 8);
            __m128i v_disty = __lsx_vsrli_h(v_fy, 8);
            v_distx = __lsx_vsrli_h(__lsx_vadd_w(v_distx, v_fxy_r), 4);
            v_disty = __lsx_vsrli_h(__lsx_vadd_w(v_disty, v_fxy_r), 4);
            v_distx = __lsx_vshuf_h(shuffleMask1, zero, v_distx);
            v_disty = __lsx_vshuf_h(shuffleMask1, zero, v_disty);

            interpolate_4_pixels_16_lsx(tl, tr, bl, br, v_distx, v_disty, b);
            b += 4;
            v_fx = __lsx_vadd_w(v_fx, v_fdx);
            v_fy = __lsx_vadd_w(v_fy, v_fdy);
        }
        fx = __lsx_vpickve2gr_w(v_fx, 0);
        fy = __lsx_vpickve2gr_w(v_fy, 0);
#endif
        while (b < boundedEnd) {
            int x = (fx >> 16);
            int y = (fy >> 16);

            const uint *s1 = (const uint *)image.scanLine(y);
            const uint *s2 = (const uint *)image.scanLine(y + 1);

            if (hasFastInterpolate4()) {
                int distx = (fx & 0x0000ffff) >> 8;
                int disty = (fy & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(s1 + x, s2 + x, distx, disty);
            } else {
                int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(s1[x], s1[x + 1], s2[x], s2[x + 1], distx, disty);
            }

            fx += fdx;
            fy += fdy;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        int y1 = (fy >> 16);
        int y2;

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uint *s1 = (const uint *)image.scanLine(y1);
        const uint *s2 = (const uint *)image.scanLine(y2);

        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];

        if (hasFastInterpolate4()) {
            int distx = (fx & 0x0000ffff) >> 8;
            int disty = (fy & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);
        } else {
            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
            int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
            *b = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
        }

        fx += fdx;
        fy += fdy;
        ++b;
    }
}